

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long lVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  ulong uVar13;
  parasail_result_t *ppVar14;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  __m128i *__dest;
  __m128i *__dest_00;
  __m128i *__dest_01;
  __m128i *__dest_02;
  __m128i *ptr;
  __m128i *ptr_00;
  long lVar15;
  __m128i *len;
  long lVar16;
  size_t __n;
  long lVar17;
  longlong lVar18;
  uint uVar19;
  int iVar21;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  longlong extraout_RDX_06;
  long lVar22;
  longlong lVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  longlong lVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar37 [16];
  long lVar40;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  __m128i_64_t B;
  long lVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  long lVar46;
  long lVar51;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar52 [16];
  long lVar53;
  long lVar56;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  __m128i_64_t B_1;
  undefined1 auVar57 [16];
  __m128i_64_t B_4;
  undefined1 auVar58 [16];
  __m128i_64_t B_3;
  undefined1 auVar59 [16];
  long lVar60;
  long lVar61;
  long lVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  long lVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  __m128i_64_t B_5;
  int local_21c;
  undefined1 local_218 [16];
  long local_1f0;
  undefined1 local_1c8 [16];
  ulong uStack_1b0;
  undefined1 local_1a8 [16];
  long local_170;
  long local_168;
  long lStack_140;
  undefined1 local_138 [16];
  undefined1 local_a8 [16];
  long local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  undefined1 local_78 [16];
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  int iVar20;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_table_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar6 = (profile->profile64).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sw_stats_table_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_table_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar31 = profile->s1Len;
        uVar13 = (ulong)uVar31;
        if ((int)uVar31 < 1) {
          parasail_sw_stats_table_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_table_scan_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_stats_table_scan_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_table_scan_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_table_scan_profile_sse41_128_64_cold_1();
        }
        else {
          uVar30 = uVar13 + 1;
          pvVar8 = (profile->profile64).matches;
          iVar20 = ppVar7->min;
          uVar33 = 0x8000000000000000 - (long)iVar20;
          if (iVar20 != -open && SBORROW4(iVar20,-open) == iVar20 + open < 0) {
            uVar33 = (ulong)(uint)open | 0x8000000000000000;
          }
          pvVar9 = (profile->profile64).similar;
          iVar20 = ppVar7->max;
          local_1a8._8_8_ = local_1a8._0_8_;
          local_1a8._0_8_ = (long)iVar20;
          ppVar14 = parasail_result_new_table3((uint)uVar30 & 0x7ffffffe,s2Len);
          if (ppVar14 != (parasail_result_t *)0x0) {
            uVar34 = uVar30 >> 1;
            ppVar14->flag = ppVar14->flag | 0x2830404;
            b = parasail_memalign___m128i(0x10,uVar34);
            b_00 = parasail_memalign___m128i(0x10,uVar34);
            b_01 = parasail_memalign___m128i(0x10,uVar34);
            b_02 = parasail_memalign___m128i(0x10,uVar34);
            b_03 = parasail_memalign___m128i(0x10,uVar34);
            b_04 = parasail_memalign___m128i(0x10,uVar34);
            b_05 = parasail_memalign___m128i(0x10,uVar34);
            b_06 = parasail_memalign___m128i(0x10,uVar34);
            __dest = parasail_memalign___m128i(0x10,uVar34);
            __dest_00 = parasail_memalign___m128i(0x10,uVar34);
            __dest_01 = parasail_memalign___m128i(0x10,uVar34);
            __dest_02 = parasail_memalign___m128i(0x10,uVar34);
            ptr = parasail_memalign___m128i(0x10,uVar34);
            ptr_00 = parasail_memalign___m128i(0x10,uVar34);
            if (b == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_02 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_03 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_04 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_05 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_06 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_02 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar35 = (ulong)(uint)gap;
            lVar1 = uVar33 + 1;
            lVar15 = 0x7ffffffffffffffe - (long)iVar20;
            auVar64._8_4_ = (int)lVar1;
            auVar64._0_8_ = lVar1;
            auVar64._12_4_ = (int)((ulong)lVar1 >> 0x20);
            local_78._8_4_ = (int)lVar15;
            local_78._0_8_ = lVar15;
            local_78._12_4_ = (int)((ulong)lVar15 >> 0x20);
            c[1] = extraout_RDX;
            c[0] = uVar34;
            len = b_05;
            parasail_memset___m128i(b_03,c,(size_t)b_05);
            c_00[1] = extraout_RDX_00;
            c_00[0] = uVar34;
            parasail_memset___m128i(b_04,c_00,(size_t)len);
            c_01[1] = extraout_RDX_01;
            c_01[0] = uVar34;
            parasail_memset___m128i(b_05,c_01,(size_t)len);
            c_02[1] = extraout_RDX_02;
            c_02[0] = uVar34;
            parasail_memset___m128i(b_06,c_02,(size_t)len);
            c_03[1] = extraout_RDX_03;
            c_03[0] = uVar34;
            parasail_memset___m128i(b,c_03,(size_t)len);
            c_04[1] = extraout_RDX_04;
            c_04[0] = uVar34;
            parasail_memset___m128i(b_00,c_04,(size_t)len);
            c_05[1] = extraout_RDX_05;
            c_05[0] = uVar34;
            parasail_memset___m128i(b_01,c_05,(size_t)len);
            c_06[1] = extraout_RDX_06;
            c_06[0] = uVar34;
            parasail_memset___m128i(b_02,c_06,(size_t)len);
            uVar10 = (uint)uVar34;
            uVar12 = uVar10 - 1;
            lVar46 = -(ulong)(uint)open;
            lVar51 = -(ulong)(uint)open;
            lVar16 = (ulong)uVar12 << 4;
            auVar37 = pmovsxbq(extraout_XMM0,0x101);
            auVar68._8_4_ = 0xffffffff;
            auVar68._0_8_ = 0xffffffffffffffff;
            auVar68._12_4_ = 0xffffffff;
            uVar25 = uVar34;
            do {
              plVar2 = (long *)((long)*ptr + lVar16);
              *plVar2 = lVar46;
              plVar2[1] = lVar51;
              *(undefined1 (*) [16])((long)*ptr_00 + lVar16) = auVar37;
              uStack_1b0 = (ulong)(uint)gap;
              lVar46 = lVar46 - uVar35;
              lVar51 = lVar51 - uStack_1b0;
              lVar45 = auVar37._8_8_;
              auVar37._0_8_ = auVar37._0_8_ + 1;
              auVar37._8_8_ = lVar45 - auVar68._8_8_;
              lVar16 = lVar16 + -0x10;
              iVar20 = (int)uVar25;
              uVar19 = iVar20 - 1;
              uVar25 = (ulong)uVar19;
            } while (uVar19 != 0 && 0 < iVar20);
            __n = uVar34 << 4;
            uVar25 = 1;
            if (1 < s2Len) {
              uVar25 = (ulong)(uint)s2Len;
            }
            lVar51 = (ulong)(uVar10 + (uVar10 == 0)) << 4;
            local_168 = uVar34 * (uint)s2Len * 4;
            lVar46 = (ulong)(uint)s2Len * 4;
            local_170 = 0;
            uVar34 = 0;
            local_21c = 0;
            lStack_140 = auVar64._8_8_;
            local_a8._8_8_ = lStack_140;
            local_a8._0_8_ = lVar1;
            lStack_80 = lStack_140;
            lStack_90 = lStack_140;
            local_1f0 = lVar1;
            local_98 = lVar1;
            local_88 = lVar1;
            do {
              lVar17 = (long)(int)(ppVar7->mapper[(byte)s2[uVar34]] * uVar10) * 0x10;
              lStack_50 = b_06[uVar12][0];
              local_58 = 0;
              lStack_40 = b_05[uVar12][0];
              local_48 = 0;
              auVar68 = (undefined1  [16])0x0;
              lVar29 = 0;
              auVar37 = (undefined1  [16])0x0;
              local_218 = (undefined1  [16])0x0;
              lVar16 = 0;
              lVar45 = 0;
              auVar64 = local_138;
              lVar61 = lVar1;
              lVar22 = lStack_140;
              local_138._0_8_ = 0;
              local_138._8_8_ = b_04[uVar12][0];
              lVar60 = 0;
              lVar18 = b_03[uVar12][0];
              do {
                plVar2 = (long *)((long)*b_03 + lVar29);
                lVar67 = *plVar2;
                lVar26 = plVar2[1];
                auVar3 = *(undefined1 (*) [16])((long)*b_04 + lVar29);
                plVar2 = (long *)((long)*b + lVar29);
                lVar53 = lVar67 - (ulong)(uint)open;
                lVar56 = lVar26 - (ulong)(uint)open;
                uStack_1b0 = (ulong)(uint)gap;
                lVar36 = *plVar2 - uVar35;
                lVar40 = plVar2[1] - uStack_1b0;
                lVar32 = lVar40;
                if (lVar40 < lVar56) {
                  lVar32 = lVar56;
                }
                lVar62 = lVar36;
                if (lVar36 < lVar53) {
                  lVar62 = lVar53;
                }
                auVar54._8_8_ = -(ulong)(lVar40 < lVar56);
                auVar54._0_8_ = -(ulong)(lVar36 < lVar53);
                auVar65 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar29),auVar3,auVar54);
                auVar4 = *(undefined1 (*) [16])((long)*b_05 + lVar29);
                auVar70 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar29),auVar4,auVar54);
                auVar5 = *(undefined1 (*) [16])((long)*b_06 + lVar29);
                auVar54 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar29),auVar5,auVar54);
                plVar2 = (long *)((long)*ptr + lVar29);
                lVar16 = lVar16 + *plVar2;
                lVar45 = lVar45 + plVar2[1];
                lVar36 = lVar45;
                if (lVar45 < lVar22) {
                  lVar36 = lVar22;
                }
                lVar40 = lVar16;
                if (lVar16 < lVar61) {
                  lVar40 = lVar61;
                }
                auVar63._8_8_ = -(ulong)(lVar45 < lVar22);
                auVar63._0_8_ = -(ulong)(lVar16 < lVar61);
                auVar41._0_8_ = -(ulong)(lVar16 == lVar61);
                auVar41._8_8_ = -(ulong)(lVar45 == lVar22);
                auVar41 = auVar41 | auVar63;
                local_218 = pblendvb(local_1a8,local_218,auVar41);
                auVar37 = pblendvb(in_XMM3,auVar37,auVar41);
                plVar2 = (long *)((long)*ptr_00 + lVar29);
                auVar52._0_8_ = auVar64._0_8_ + *plVar2;
                auVar52._8_8_ = auVar64._8_8_ + plVar2[1];
                auVar68 = pblendvb(auVar52,auVar68,auVar41);
                plVar2 = (long *)((long)pvVar6 + lVar29 + lVar17);
                lVar60 = lVar60 + *plVar2;
                lVar61 = lVar18 + plVar2[1];
                lVar45 = lVar32;
                if (lVar32 <= lVar61) {
                  lVar45 = lVar61;
                }
                lVar16 = lVar62;
                if (lVar62 <= lVar60) {
                  lVar16 = lVar60;
                }
                auVar38._8_8_ = -(ulong)(lVar61 < lVar32);
                auVar38._0_8_ = -(ulong)(lVar60 < lVar62);
                plVar2 = (long *)((long)pvVar8 + lVar29 + lVar17);
                auVar59._0_8_ = local_138._0_8_ + *plVar2;
                auVar59._8_8_ = local_138._8_8_ + plVar2[1];
                local_1a8 = pblendvb(auVar59,auVar65,auVar38);
                plVar2 = (long *)((long)pvVar9 + lVar29 + lVar17);
                auVar57._0_8_ = local_48 + *plVar2;
                auVar57._8_8_ = lStack_40 + plVar2[1];
                in_XMM3 = pblendvb(auVar57,auVar70,auVar38);
                auVar47._8_4_ = 0xffffffff;
                auVar47._0_8_ = 0xffffffffffffffff;
                auVar47._12_4_ = 0xffffffff;
                auVar55._0_8_ = auVar54._0_8_ + 1;
                auVar55._8_8_ = auVar54._8_8_ - auVar47._8_8_;
                auVar66._0_8_ = local_58 + 1;
                auVar66._8_8_ = lStack_50 - auVar47._8_8_;
                auVar64 = pblendvb(auVar66,auVar55,auVar38);
                plVar2 = (long *)((long)*b + lVar29);
                *plVar2 = lVar62;
                plVar2[1] = lVar32;
                *(undefined1 (*) [16])((long)*b_00 + lVar29) = auVar65;
                *(undefined1 (*) [16])((long)*b_01 + lVar29) = auVar70;
                *(undefined1 (*) [16])((long)*b_02 + lVar29) = auVar55;
                plVar2 = (long *)((long)*b_03 + lVar29);
                *plVar2 = lVar60;
                plVar2[1] = lVar61;
                *(undefined1 (*) [16])((long)*b_04 + lVar29) = auVar59;
                *(undefined1 (*) [16])((long)*b_05 + lVar29) = auVar57;
                *(undefined1 (*) [16])((long)*b_06 + lVar29) = auVar66;
                lVar29 = lVar29 + 0x10;
                local_58 = auVar5._0_8_;
                lStack_50 = auVar5._8_8_;
                local_48 = auVar4._0_8_;
                lStack_40 = auVar4._8_8_;
                local_138._0_8_ = auVar3._0_8_;
                local_138._8_8_ = auVar3._8_8_;
                lVar61 = lVar40;
                lVar22 = lVar36;
                lVar60 = lVar67;
                lVar18 = lVar26;
              } while (lVar51 != lVar29);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = in_XMM3._0_8_;
              in_XMM3 = auVar3 << 0x40;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = auVar64._0_8_;
              local_138 = auVar4 << 0x40;
              lVar45 = (*ptr)[0];
              lVar61 = lVar16 + (*ptr)[1];
              auVar70._0_8_ = -(ulong)(lVar40 == lVar45);
              auVar70._8_8_ = -(ulong)(lVar36 == lVar61);
              auVar65._8_8_ = -(ulong)(lVar36 < lVar61);
              auVar65._0_8_ = -(ulong)(lVar40 < lVar45);
              auVar65 = auVar65 | auVar70;
              auVar64 = pblendvb(auVar68,(undefined1  [16])*ptr_00,auVar65);
              auVar5._8_8_ = 0;
              auVar5._0_8_ = auVar64._0_8_;
              auVar69 = auVar5 << 0x40;
              if (lVar45 < lVar40) {
                lVar45 = lVar40;
              }
              lVar61 = lVar16;
              if (lVar16 < lVar45) {
                lVar61 = lVar45;
              }
              lVar22 = lVar1;
              if (lVar1 < 1) {
                lVar22 = 0;
              }
              auVar48._8_8_ = -(ulong)(lVar16 < lVar45);
              auVar48._0_8_ = -(ulong)(0 < lVar1);
              auVar68 = pblendvb(local_138,auVar69,auVar48);
              auVar64 = pblendvb(auVar37,in_XMM3,auVar65);
              local_1c8._8_8_ = 0;
              local_1c8._0_8_ = auVar64._0_8_;
              local_1c8 = local_1c8 << 0x40;
              auVar37 = pblendvb(in_XMM3,local_1c8,auVar48);
              auVar11._8_8_ = 0;
              auVar11._0_8_ = local_1a8._0_8_;
              local_1a8 = auVar11 << 0x40;
              auVar64 = pblendvb(local_218,local_1a8,auVar65);
              local_218._8_8_ = 0;
              local_218._0_8_ = auVar64._0_8_;
              local_218 = local_218 << 0x40;
              auVar64 = pblendvb(local_1a8,local_218,auVar48);
              lVar26 = 0;
              lVar16 = local_170;
              lVar60 = local_168;
              lVar17 = lVar1;
              lVar29 = local_88;
              lVar67 = lStack_80;
              do {
                lVar32 = *(long *)((long)*b_03 + lVar26);
                lVar36 = *(long *)((long)*b_03 + lVar26 + 8);
                lVar56 = lVar22 - (ulong)(uint)open;
                lVar62 = lVar61 - (ulong)(uint)open;
                lVar40 = lVar17 - uVar35;
                lVar53 = lVar45 - uStack_1b0;
                lVar17 = lVar40;
                if (lVar40 < lVar56) {
                  lVar17 = lVar56;
                }
                lVar45 = lVar53;
                if (lVar53 < lVar62) {
                  lVar45 = lVar62;
                }
                lVar22 = *(long *)((long)*b + lVar26);
                lVar61 = *(long *)((long)*b + lVar26 + 8);
                if (lVar22 < lVar32) {
                  lVar22 = lVar32;
                }
                if (lVar61 < lVar36) {
                  lVar61 = lVar36;
                }
                auVar39._8_8_ = -(ulong)(lVar53 < lVar62);
                auVar39._0_8_ = -(ulong)(lVar40 < lVar56);
                local_218 = pblendvb(local_218,auVar64,auVar39);
                if (lVar22 <= lVar17) {
                  lVar22 = lVar17;
                }
                local_1c8 = pblendvb(local_1c8,auVar37,auVar39);
                if (lVar61 <= lVar45) {
                  lVar61 = lVar45;
                }
                auVar68 = pblendvb(auVar69,auVar68,auVar39);
                if (lVar22 < 1) {
                  lVar22 = 0;
                }
                if (lVar61 < 1) {
                  lVar61 = 0;
                }
                plVar2 = (long *)((long)*b_03 + lVar26);
                auVar42._0_8_ = -(ulong)(*plVar2 == lVar22);
                auVar42._8_8_ = -(ulong)(plVar2[1] == lVar61);
                auVar49._0_8_ = -(ulong)(lVar22 == lVar17);
                auVar49._8_8_ = -(ulong)(lVar61 == lVar45);
                auVar64 = blendvpd(*(undefined1 (*) [16])((long)*b_00 + lVar26),local_218,auVar49);
                auVar64 = blendvpd(auVar64,*(undefined1 (*) [16])((long)*b_04 + lVar26),auVar42);
                auVar37 = blendvpd(*(undefined1 (*) [16])((long)*b_01 + lVar26),local_1c8,auVar49);
                auVar37 = blendvpd(auVar37,*(undefined1 (*) [16])((long)*b_05 + lVar26),auVar42);
                auVar69._0_8_ = auVar68._0_8_ + 1;
                auVar69._8_8_ = auVar68._8_8_ + 1;
                auVar68 = blendvpd(*(undefined1 (*) [16])((long)*b_02 + lVar26),auVar69,auVar49);
                auVar68 = blendvpd(auVar68,*(undefined1 (*) [16])((long)*b_06 + lVar26),auVar42);
                auVar58._0_8_ = -(ulong)(lVar22 == 0);
                auVar58._8_8_ = -(ulong)(lVar61 == 0);
                auVar64 = ~auVar58 & auVar64;
                if (lVar22 <= (long)local_78._0_8_) {
                  local_78._0_8_ = lVar22;
                }
                auVar37 = ~auVar58 & auVar37;
                auVar68 = ~auVar58 & auVar68;
                if (lVar61 <= (long)local_78._8_8_) {
                  local_78._8_8_ = lVar61;
                }
                if (local_98 <= lVar22) {
                  local_98 = lVar22;
                }
                plVar2 = (long *)((long)*b_03 + lVar26);
                *plVar2 = lVar22;
                plVar2[1] = lVar61;
                if (lStack_90 <= lVar61) {
                  lStack_90 = lVar61;
                }
                if (local_98 <= auVar64._0_8_) {
                  local_98 = auVar64._0_8_;
                }
                *(undefined1 (*) [16])((long)*b_04 + lVar26) = auVar64;
                if (lStack_90 <= auVar64._8_8_) {
                  lStack_90 = auVar64._8_8_;
                }
                if (local_98 <= auVar37._0_8_) {
                  local_98 = auVar37._0_8_;
                }
                *(undefined1 (*) [16])((long)*b_05 + lVar26) = auVar37;
                if (lStack_90 <= auVar37._8_8_) {
                  lStack_90 = auVar37._8_8_;
                }
                if (local_98 <= auVar68._0_8_) {
                  local_98 = auVar68._0_8_;
                }
                *(undefined1 (*) [16])((long)*b_06 + lVar26) = auVar68;
                if (lStack_90 <= auVar68._8_8_) {
                  lStack_90 = auVar68._8_8_;
                }
                lVar32 = *((ppVar14->field_4).trace)->trace_del_table;
                *(int *)(lVar32 + lVar16) = (int)lVar22;
                local_88 = lVar22;
                if (lVar22 <= lVar29) {
                  local_88 = lVar29;
                }
                *(int *)(lVar32 + lVar60) = (int)lVar61;
                lStack_80 = lVar61;
                if (lVar61 <= lVar67) {
                  lStack_80 = lVar67;
                }
                lVar29 = *(long *)((long)((ppVar14->field_4).trace)->trace_del_table + 8);
                *(int *)(lVar29 + lVar16) = auVar64._0_4_;
                *(int *)(lVar29 + lVar60) = auVar64._8_4_;
                lVar29 = *(long *)((long)((ppVar14->field_4).trace)->trace_del_table + 0x10);
                *(int *)(lVar29 + lVar16) = auVar37._0_4_;
                *(int *)(lVar29 + lVar60) = auVar37._8_4_;
                lVar29 = *(long *)((long)((ppVar14->field_4).trace)->trace_del_table + 0x18);
                *(int *)(lVar29 + lVar16) = auVar68._0_4_;
                *(int *)(lVar29 + lVar60) = auVar68._8_4_;
                lVar26 = lVar26 + 0x10;
                lVar60 = lVar60 + lVar46;
                lVar16 = lVar16 + lVar46;
                lVar29 = local_88;
                lVar67 = lStack_80;
              } while (lVar51 != lVar26);
              uVar27 = -(ulong)((long)local_a8._8_8_ < lStack_80);
              auVar43._8_8_ = uVar27;
              auVar43._0_8_ = -(ulong)((long)local_a8._0_8_ < local_88);
              if ((((((((((((((((auVar43 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar43 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar43 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar43 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar43 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar43 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (uVar27 >> 7 & 1) != 0) || (uVar27 >> 0xf & 1) != 0) ||
                      (uVar27 >> 0x17 & 1) != 0) || (uVar27 >> 0x1f & 1) != 0) ||
                    (uVar27 >> 0x27 & 1) != 0) || (uVar27 >> 0x2f & 1) != 0) ||
                  (uVar27 >> 0x37 & 1) != 0) || (long)local_a8._8_8_ < lStack_80) {
                local_1f0 = lStack_80;
                if (lStack_80 < local_88) {
                  local_1f0 = local_88;
                }
                local_a8._8_4_ = (int)local_1f0;
                local_a8._0_8_ = local_1f0;
                local_a8._12_4_ = (int)((ulong)local_1f0 >> 0x20);
                memcpy(__dest,b_03,__n);
                memcpy(__dest_00,b_04,__n);
                memcpy(__dest_01,b_05,__n);
                memcpy(__dest_02,b_06,__n);
                local_21c = (int)uVar34;
              }
              uVar34 = uVar34 + 1;
              local_168 = local_168 + 4;
              local_170 = local_170 + 4;
            } while (uVar34 != uVar25);
            lVar18 = 0;
            iVar20 = 0;
            if ((uVar30 & 0x7ffffffe) == 0) {
              iVar24 = 0;
              iVar21 = 0;
            }
            else {
              uVar30 = 0;
              lVar23 = 0;
              lVar28 = 0;
              do {
                if ((*__dest)[uVar30] == local_1f0) {
                  uVar31 = 0;
                  if ((uVar30 & 1) != 0) {
                    uVar31 = uVar10;
                  }
                  uVar31 = uVar31 + ((uint)(uVar30 >> 1) & 0x7fffffff);
                  if ((int)uVar31 < (int)uVar13) {
                    lVar18 = (*__dest_00)[uVar30];
                    lVar28 = (*__dest_01)[uVar30];
                    lVar23 = (*__dest_02)[uVar30];
                    uVar13 = (ulong)uVar31;
                  }
                }
                iVar21 = (int)lVar23;
                iVar24 = (int)lVar28;
                iVar20 = (int)lVar18;
                uVar31 = (uint)uVar13;
                uVar30 = uVar30 + 1;
              } while ((uVar10 & 0x3fffffff) * 2 != (int)uVar30);
            }
            auVar44._8_8_ = -(ulong)((long)local_78._8_8_ <= (long)uVar33);
            auVar44._0_8_ = -(ulong)((long)local_78._0_8_ <= (long)uVar33);
            auVar50._8_8_ = -(ulong)(lVar15 < lStack_90);
            auVar50._0_8_ = -(ulong)(lVar15 < local_98);
            auVar50 = auVar50 | auVar44;
            if ((((((((((((((((auVar50 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar50 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar50 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar50 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar50 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar50 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar50 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar50 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar50 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar50 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar50 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar50 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar50[0xf] < '\0') {
              *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
              local_1f0 = 0;
              iVar20 = 0;
              iVar24 = 0;
              iVar21 = 0;
              local_21c = 0;
              uVar31 = 0;
            }
            ppVar14->score = (int)local_1f0;
            ppVar14->end_query = uVar31;
            ppVar14->end_ref = local_21c;
            ((ppVar14->field_4).stats)->matches = iVar20;
            ((ppVar14->field_4).stats)->similar = iVar24;
            ((ppVar14->field_4).stats)->length = iVar21;
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(__dest_02);
            parasail_free(__dest_01);
            parasail_free(__dest_00);
            parasail_free(__dest);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(b_01);
            parasail_free(b_00);
            parasail_free(b);
            return ppVar14;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m128i*)profile->profile64.score;
    pvPm = (__m128i*)profile->profile64.matches;
    pvPs = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm_slli_si128(_mm_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            vGapperL = _mm_add_epi64(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i case0;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHpM = _mm_slli_si128(vHpM, 8);
        vHpS = _mm_slli_si128(vHpS, 8);
        vHpL = _mm_slli_si128(vHpL, 8);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi64(vH, vGapO);
            vE_ext = _mm_sub_epi64(vE, vGapE);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vGapper = _mm_add_epi64(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vF, vGapper),
                    _mm_cmpeq_epi64(vF, vGapper));
            vF = _mm_max_epi64_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi64(vHp, vW);
            vHpM = _mm_add_epi64(vHpM, vWM);
            vHpS = _mm_add_epi64(vHpS, vWS);
            vHpL = _mm_add_epi64(vHpL, vOne);
            case1 = _mm_cmpgt_epi64_rpl(vE, vHp);
            vHt = _mm_max_epi64_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHtM = _mm_slli_si128(vHtM, 8);
        vHtS = _mm_slli_si128(vHtS, 8);
        vHtL = _mm_slli_si128(vHtL, 8);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi64(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi64_rpl(vGapper, vF),
                _mm_cmpeq_epi64(vGapper, vF));
        vF = _mm_max_epi64_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            __m128i vFtM = _mm_slli_si128(vFM, 8);
            __m128i vFtS = _mm_slli_si128(vFS, 8);
            __m128i vFtL = _mm_slli_si128(vFL, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vFt, vF),
                    _mm_cmpeq_epi64(vFt, vF));
            vF = _mm_max_epi64_rpl(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vFM = _mm_slli_si128(vFM, 8);
        vFS = _mm_slli_si128(vFS, 8);
        vFL = _mm_slli_si128(vFL, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi64_rpl(vF, vHt);
        vH = _mm_max_epi64_rpl(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi64(vH, vGapO);
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vH = _mm_max_epi64_rpl(vHp, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            vH = _mm_max_epi64_rpl(vH, vZero);
            case1 = _mm_cmpeq_epi64(vH, vHp);
            case2 = _mm_cmpeq_epi64(vH, vF);
            case0 = _mm_cmpeq_epi64(vH, vZero);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm_blendv_epi8(vHM, vZero, case0);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm_blendv_epi8(vHS, vZero, case0);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm_blendv_epi8(vHL, vZero, case0);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m128i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m128i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            __m128i vHM = _mm_load_si128(pvHM + offset);
            __m128i vHS = _mm_load_si128(pvHS + offset);
            __m128i vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int64_t *t = (int64_t*)pvHMax;
        int64_t *m = (int64_t*)pvHMMax;
        int64_t *s = (int64_t*)pvHSMax;
        int64_t *l = (int64_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}